

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar-parser.cpp
# Opt level: O2

uint32_t grammar_parser::generate_symbol_id(parse_state *state,string *base_name)

{
  uint __val;
  mapped_type *pmVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __val = (uint)(state->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::operator+(&local_50,base_name,'_');
  std::__cxx11::to_string(&local_70,__val);
  std::operator+(&local_30,&local_50,&local_70);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&state->symbol_ids,&local_30);
  *pmVar1 = __val;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __val;
}

Assistant:

static uint32_t generate_symbol_id(parse_state & state, const std::string & base_name) {
        uint32_t next_id = static_cast<uint32_t>(state.symbol_ids.size());
        state.symbol_ids[base_name + '_' + std::to_string(next_id)] = next_id;
        return next_id;
    }